

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void __thiscall cmState::Snapshot::SetDefaultDefinitions(Snapshot *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  PointerType pSVar4;
  PointerType pcVar5;
  size_t sVar6;
  char *pcVar7;
  PointerType pBVar8;
  PositionType *this_00;
  char temp [1024];
  string local_470;
  long *local_450 [2];
  long local_440 [2];
  allocator local_429;
  string local_428 [32];
  
  paVar1 = &local_428[0].field_2;
  local_428[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"UNIX","");
  paVar2 = &local_470.field_2;
  local_470._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"1","");
  this_00 = &this->Position;
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,local_428,local_470._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_428[0]._M_dataplus._M_p,local_428[0].field_2._M_allocated_capacity + 1);
  }
  local_428[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"CMAKE_HOST_UNIX","");
  local_470._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"1","");
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,local_428,local_470._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_428[0]._M_dataplus._M_p,local_428[0].field_2._M_allocated_capacity + 1);
  }
  uVar3 = cmVersion::GetMinorVersion();
  sprintf((char *)local_428,"%d",(ulong)uVar3);
  local_470._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"CMAKE_MINOR_VERSION","");
  local_450[0] = local_440;
  sVar6 = strlen((char *)local_428);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_450,local_428,(long)&local_428[0]._M_dataplus._M_p + sVar6);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_470,(char *)local_450[0]);
  if (local_450[0] != local_440) {
    operator_delete(local_450[0],local_440[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  uVar3 = cmVersion::GetMajorVersion();
  sprintf((char *)local_428,"%d",(ulong)uVar3);
  local_470._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"CMAKE_MAJOR_VERSION","");
  local_450[0] = local_440;
  sVar6 = strlen((char *)local_428);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_450,local_428,(long)&local_428[0]._M_dataplus._M_p + sVar6);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_470,(char *)local_450[0]);
  if (local_450[0] != local_440) {
    operator_delete(local_450[0],local_440[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  uVar3 = cmVersion::GetPatchVersion();
  sprintf((char *)local_428,"%d",(ulong)uVar3);
  local_470._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"CMAKE_PATCH_VERSION","");
  local_450[0] = local_440;
  sVar6 = strlen((char *)local_428);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_450,local_428,(long)&local_428[0]._M_dataplus._M_p + sVar6);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_470,(char *)local_450[0]);
  if (local_450[0] != local_440) {
    operator_delete(local_450[0],local_440[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  uVar3 = cmVersion::GetTweakVersion();
  sprintf((char *)local_428,"%d",(ulong)uVar3);
  local_470._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"CMAKE_TWEAK_VERSION","");
  local_450[0] = local_440;
  sVar6 = strlen((char *)local_428);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_450,local_428,(long)&local_428[0]._M_dataplus._M_p + sVar6);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_470,(char *)local_450[0]);
  if (local_450[0] != local_440) {
    operator_delete(local_450[0],local_440[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  local_470._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"CMAKE_VERSION","");
  pcVar7 = cmVersion::GetCMakeVersion();
  std::__cxx11::string::string((string *)local_450,pcVar7,&local_429);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_470,(char *)local_450[0]);
  if (local_450[0] != local_440) {
    operator_delete(local_450[0],local_440[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  local_470._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"CMAKE_FILES_DIRECTORY","");
  local_450[0] = local_440;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"/CMakeFiles","");
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_470,(char *)local_450[0]);
  if (local_450[0] != local_440) {
    operator_delete(local_450[0],local_440[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(this_00);
  pBVar8 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar4->BuildSystemDirectory);
  local_470._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_470,"INCLUDE_REGULAR_EXPRESSION","");
  cmPropertyMap::SetProperty(&pBVar8->Properties,&local_470,"^.*$");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != paVar2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmState::Snapshot::SetDefaultDefinitions()
{
  /* Up to CMake 2.4 here only WIN32, UNIX and APPLE were set.
    With CMake must separate between target and host platform. In most cases
    the tests for WIN32, UNIX and APPLE will be for the target system, so an
    additional set of variables for the host system is required ->
    CMAKE_HOST_WIN32, CMAKE_HOST_UNIX, CMAKE_HOST_APPLE.
    WIN32, UNIX and APPLE are now set in the platform files in
    Modules/Platforms/.
    To keep cmake scripts (-P) and custom language and compiler modules
    working, these variables are still also set here in this place, but they
    will be reset in CMakeSystemSpecificInformation.cmake before the platform
    files are executed. */
  #if defined(_WIN32)
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  #else
    this->SetDefinition("UNIX", "1");
    this->SetDefinition("CMAKE_HOST_UNIX", "1");
  #endif
  #if defined(__CYGWIN__)
    if(cmSystemTools::IsOn(cmSystemTools::GetEnv("CMAKE_LEGACY_CYGWIN_WIN32")))
      {
      this->SetDefinition("WIN32", "1");
      this->SetDefinition("CMAKE_HOST_WIN32", "1");
      }
  #endif
  #if defined(__APPLE__)
    this->SetDefinition("APPLE", "1");
    this->SetDefinition("CMAKE_HOST_APPLE", "1");
  #endif

    char temp[1024];
    sprintf(temp, "%d", cmVersion::GetMinorVersion());
    this->SetDefinition("CMAKE_MINOR_VERSION", temp);
    sprintf(temp, "%d", cmVersion::GetMajorVersion());
    this->SetDefinition("CMAKE_MAJOR_VERSION", temp);
    sprintf(temp, "%d", cmVersion::GetPatchVersion());
    this->SetDefinition("CMAKE_PATCH_VERSION", temp);
    sprintf(temp, "%d", cmVersion::GetTweakVersion());
    this->SetDefinition("CMAKE_TWEAK_VERSION", temp);
    this->SetDefinition("CMAKE_VERSION",
                                      cmVersion::GetCMakeVersion());

    this->SetDefinition("CMAKE_FILES_DIRECTORY",
                        cmake::GetCMakeFilesDirectory());

  // Setup the default include file regular expression (match everything).
  this->Position->BuildSystemDirectory
      ->Properties.SetProperty("INCLUDE_REGULAR_EXPRESSION", "^.*$");
}